

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

void __thiscall
TasGrid::GridSequence::applyTransformationTransposed<1>(GridSequence *this,double *weights)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  _Bit_type *p_Var4;
  pointer piVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  _Bit_type *p_Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer piVar16;
  GridSequence *this_00;
  size_type sVar17;
  ulong uVar18;
  double dVar19;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> parents;
  allocator_type local_132;
  bool local_131;
  size_type local_130;
  GridSequence *local_128;
  MultiIndexSet *local_120;
  ulong local_118;
  size_type local_110;
  vector<bool,_std::allocator<bool>_> local_108;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  double *local_b0;
  ulong local_a8;
  pointer local_a0;
  pointer local_98;
  ulong local_90;
  ulong *local_88;
  ulong *local_80;
  pointer local_78;
  vector<int,_std::allocator<int>_> local_70;
  Data2D<int> local_58;
  
  local_120 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_120 = &(this->super_BaseCanonicalGrid).needed;
  }
  local_130 = (size_type)local_120->cache_num_indexes;
  local_128 = this;
  local_b0 = weights;
  MultiIndexManipulations::computeLevels(&local_70,local_120);
  puVar9 = (uint *)(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  puVar10 = (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if (puVar9 != (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish &&
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      puVar6 = puVar9;
      if ((int)*puVar9 <= (int)*puVar10) {
        puVar6 = puVar10;
      }
      puVar10 = puVar6;
      puVar9 = puVar9 + 1;
    } while (puVar9 != (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  uVar8 = *puVar10;
  MultiIndexManipulations::computeDAGup(&local_58,local_120);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)(int)uVar8 + 1U,(allocator_type *)&local_108);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)(int)uVar8 + 1U,(allocator_type *)&local_108);
  local_131 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_108,local_130,&local_131,&local_132);
  if (0 < (int)uVar8) {
    uVar15 = 0x800000000000003f;
    local_118 = 0x800000000000003f;
    this_00 = local_128;
    do {
      uVar11 = uVar8;
      if (0 < (int)local_130) {
        sVar17 = 0;
        local_a8 = (ulong)uVar8;
        do {
          uVar8 = local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
          p_Var4 = local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[sVar17] == (uint)local_a8) {
            local_98 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + local_120->num_dimensions * sVar17;
            *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (int)sVar17;
            p_Var12 = local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_110 = sVar17;
            if (local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var12 = p_Var4;
              this_00 = local_128;
              uVar15 = local_118;
            }
            piVar5 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar8 != 0) {
              *p_Var12 = *p_Var12 & ~(0xffffffffffffffffU >> (-(char)uVar8 & 0x3fU));
            }
            uVar8 = (this_00->super_BaseCanonicalGrid).num_dimensions;
            sVar17 = local_110;
            if (*local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)uVar8) {
              local_78 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              iVar7 = 0;
              local_80 = local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              local_a0 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar16 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                iVar1 = piVar5[iVar7];
                if (iVar1 < (int)uVar8) {
                  iVar2 = local_78[(long)piVar16[iVar7] * local_58.stride + (long)iVar1];
                  uVar13 = (ulong)iVar2;
                  if (uVar13 != 0xffffffffffffffff) {
                    uVar14 = uVar13 + 0x3f;
                    if (-1 < (long)uVar13) {
                      uVar14 = uVar13;
                    }
                    uVar18 = (ulong)((uVar13 & uVar15) < 0x8000000000000001);
                    uVar3 = (local_80 + ((long)uVar14 >> 6))[uVar18 - 1];
                    if ((uVar3 >> (uVar13 & 0x3f) & 1) == 0) {
                      local_90 = uVar3;
                      local_88 = local_80 + ((long)uVar14 >> 6);
                      dVar19 = evalBasis(this_00,(local_120->indexes).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                                 uVar13 * local_120->num_dimensions,local_98);
                      if (0 < (int)uVar8) {
                        uVar15 = 0;
                        do {
                          local_b0[(long)(int)(iVar2 * uVar8) + uVar15] =
                               local_b0[(long)(int)(iVar2 * uVar8) + uVar15] -
                               local_b0[(long)(int)(uVar8 * (int)local_110) + uVar15] * dVar19;
                          uVar15 = uVar15 + 1;
                        } while (uVar8 != uVar15);
                      }
                      local_88[uVar18 - 1] = local_90 | 1L << ((byte)iVar2 & 0x3f);
                      piVar5[(long)iVar7 + 1] = 0;
                      local_a0[(long)iVar7 + 1] = iVar2;
                      piVar16 = local_a0;
                      this_00 = local_128;
                      uVar15 = local_118;
                      sVar17 = local_110;
                      iVar7 = iVar7 + 1;
                      goto LAB_001abaa6;
                    }
                  }
                  piVar5[iVar7] = iVar1 + 1;
                }
                else {
                  piVar5[(long)iVar7 + -1] = piVar5[(long)iVar7 + -1] + 1;
                  iVar7 = iVar7 + -1;
                }
LAB_001abaa6:
                uVar8 = (this_00->super_BaseCanonicalGrid).num_dimensions;
              } while (*piVar5 < (int)uVar8);
            }
          }
          sVar17 = sVar17 + 1;
          uVar11 = (uint)local_a8;
        } while (sVar17 != local_130);
      }
      uVar8 = uVar11 - 1;
    } while (1 < (int)uVar11);
  }
  if (local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::applyTransformationTransposed(double weights[]) const{
    // mode 0: applies the transposed linear operator for interpolation and quadrature.
    // mode 1: applies the transposed linear operator for differentiation.
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<int> level = MultiIndexManipulations::computeLevels(work);
    int top_level = *std::max_element(level.begin(), level.end());

    Data2D<int> parents = MultiIndexManipulations::computeDAGup(work);

    std::vector<int> monkey_count(top_level + 1);
    std::vector<int> monkey_tail(top_level + 1);
    std::vector<bool> used(num_points);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                const int* p = work.getIndex(i);
                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                std::fill(used.begin(), used.end(), false);

                while(monkey_count[0] < num_dimensions){
                    if (monkey_count[current] < num_dimensions){
                        int branch = parents.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            if (mode == 0) {
                                weights[branch] -= weights[i] * evalBasis(work.getIndex(branch), p);
                            } else {
                                double weight_mult = evalBasis(work.getIndex(branch), p);
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -= weights[i * num_dimensions + d] * weight_mult;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}